

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2i(char *cval,long *ival,int *status)

{
  int iVar1;
  double *in_RDX;
  long *in_RSI;
  char *in_RDI;
  double dval;
  int lval;
  char msg [81];
  char sval [81];
  char dtype;
  char *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  int local_4;
  
  if (*(int *)in_RDX < 1) {
    if (*in_RDI == '\0') {
      *(undefined4 *)in_RDX = 0xcc;
      local_4 = 0xcc;
    }
    else {
      ffc2x(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
            (long *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_RDX,in_stack_ffffffffffffff40);
      if (in_stack_ffffffffffffffdf == 'X') {
        *(undefined4 *)in_RDX = 0x193;
      }
      else if (in_stack_ffffffffffffffdf == 'C') {
        iVar1 = ffc2dd((char *)in_RSI,in_RDX,(int *)CONCAT17(0x43,in_stack_ffffffffffffffd8));
        if (iVar1 < 1) {
          if ((9.223372036854776e+18 < (double)in_stack_ffffffffffffff18) ||
             ((double)in_stack_ffffffffffffff18 < -9.223372036854776e+18)) {
            *(int *)in_RDX = 0x19c;
          }
          else {
            *in_RSI = (long)(double)in_stack_ffffffffffffff18;
          }
        }
      }
      else if (in_stack_ffffffffffffffdf == 'F') {
        if ((9.223372036854776e+18 < (double)in_stack_ffffffffffffff18) ||
           ((double)in_stack_ffffffffffffff18 < -9.223372036854776e+18)) {
          *(undefined4 *)in_RDX = 0x19c;
        }
        else {
          *in_RSI = (long)(double)in_stack_ffffffffffffff18;
        }
      }
      else if (in_stack_ffffffffffffffdf == 'L') {
        *in_RSI = (long)in_stack_ffffffffffffff24;
      }
      if (*(int *)in_RDX < 1) {
        local_4 = *(int *)in_RDX;
      }
      else {
        *in_RSI = 0;
        strcpy(&stack0xffffffffffffff28,"Error in ffc2i evaluating string as an integer: ");
        strncat(&stack0xffffffffffffff28,in_RDI,0x1e);
        ffpmsg((char *)0x1762d7);
        local_4 = *(int *)in_RDX;
      }
    }
  }
  else {
    local_4 = *(int *)in_RDX;
  }
  return local_4;
}

Assistant:

int ffc2i(const char *cval,   /* I - string representation of the value */
          long *ival,         /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to an integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
              else
                *ival = (long) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *ival = (long) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (long) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2i evaluating string as an integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}